

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O3

void __thiscall nuraft::stat_elem::~stat_elem(stat_elem *this)

{
  Histogram *pHVar1;
  pointer pcVar2;
  
  pHVar1 = this->hist_;
  if ((pHVar1 != (Histogram *)0x0) && (pHVar1->bins != (HistBin *)0x0)) {
    operator_delete__(pHVar1->bins);
  }
  operator_delete(pHVar1);
  pcVar2 = (this->stat_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->stat_name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

stat_elem::~stat_elem() {
    delete hist_;
}